

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasinterval.cpp
# Opt level: O2

BOOL __thiscall LASinterval::merge(LASinterval *this,BOOL erase)

{
  U32 *pUVar1;
  _Rb_tree_color _Var2;
  U32 UVar3;
  LASintervalCell *pLVar4;
  _Base_ptr p_Var5;
  BOOL BVar6;
  LASintervalStartCell *pLVar7;
  void *pvVar8;
  _Rb_tree_node_base *p_Var9;
  LASintervalStartCell *this_00;
  int iVar10;
  LASintervalCell *pLVar11;
  _Self __tmp;
  pair<const_unsigned_int,_LASintervalCell_*> local_70;
  my_cell_map map;
  
  if (this->merged_cells != (LASintervalStartCell *)0x0) {
    if (this->merged_cells_temporary == true) {
      pLVar11 = (this->merged_cells->super_LASintervalCell).next;
      while (pLVar11 != (LASintervalCell *)0x0) {
        pLVar4 = pLVar11->next;
        operator_delete(pLVar11);
        pLVar11 = pLVar4;
      }
      operator_delete(this->merged_cells);
    }
    this->merged_cells = (LASintervalStartCell *)0x0;
  }
  pvVar8 = this->cells_to_merge;
  if ((pvVar8 == (void *)0x0) || (*(long *)((long)pvVar8 + 0x28) == 0)) {
    BVar6 = false;
  }
  else {
    if (*(long *)((long)pvVar8 + 0x28) == 1) {
      this->merged_cells_temporary = false;
      pLVar7 = *(LASintervalStartCell **)(*(long *)((long)pvVar8 + 0x18) + 0x20);
      this->merged_cells = pLVar7;
    }
    else {
      this->merged_cells_temporary = true;
      pLVar7 = (LASintervalStartCell *)operator_new(0x20);
      LASintervalStartCell::LASintervalStartCell(pLVar7);
      this->merged_cells = pLVar7;
      map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &map._M_t._M_impl.super__Rb_tree_header._M_header;
      map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pvVar8 = this->cells_to_merge;
      p_Var9 = *(_Rb_tree_node_base **)((long)pvVar8 + 0x18);
      map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while (p_Var9 != (_Rb_tree_node_base *)((long)pvVar8 + 8)) {
        pLVar11 = *(LASintervalCell **)(p_Var9 + 1);
        pUVar1 = &this->merged_cells->full;
        *pUVar1 = *pUVar1 + pLVar11[1].start;
        for (; pLVar11 != (LASintervalCell *)0x0; pLVar11 = pLVar11->next) {
          local_70.first = pLVar11->start;
          local_70.second = pLVar11;
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,LASintervalCell*>,std::_Select1st<std::pair<unsigned_int_const,LASintervalCell*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
          ::_M_insert_equal<std::pair<unsigned_int_const,LASintervalCell*>>
                    ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,LASintervalCell*>,std::_Select1st<std::pair<unsigned_int_const,LASintervalCell*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
                      *)&map,&local_70);
        }
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        pvVar8 = this->cells_to_merge;
      }
      p_Var5 = map._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,LASintervalCell*>,std::_Select1st<std::pair<unsigned_int_const,LASintervalCell*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,LASintervalCell*>,std::_Select1st<std::pair<unsigned_int_const,LASintervalCell*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
                          *)&map,(iterator)map._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
      ;
      _Var2 = p_Var5->_M_color;
      pLVar7 = this->merged_cells;
      (pLVar7->super_LASintervalCell).start = _Var2;
      UVar3 = *(U32 *)&p_Var5->field_0x4;
      (pLVar7->super_LASintervalCell).end = UVar3;
      pLVar7->total = (UVar3 - _Var2) + 1;
      if (erase) {
        operator_delete(p_Var5);
        pLVar7 = this->merged_cells;
      }
      while (map._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        p_Var5 = map._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,LASintervalCell*>,std::_Select1st<std::pair<unsigned_int_const,LASintervalCell*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
        ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,LASintervalCell*>,std::_Select1st<std::pair<unsigned_int_const,LASintervalCell*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
                            *)&map,(iterator)
                                   map._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
        UVar3 = (pLVar7->super_LASintervalCell).end;
        if ((int)this->threshold < (int)(p_Var5->_M_color - UVar3)) {
          this_00 = (LASintervalStartCell *)operator_new(0x10);
          LASintervalCell::LASintervalCell((LASintervalCell *)this_00,(LASintervalCell *)p_Var5);
          (pLVar7->super_LASintervalCell).next = (LASintervalCell *)this_00;
          this->merged_cells->total =
               (*(U32 *)&p_Var5->field_0x4 - p_Var5->_M_color) + this->merged_cells->total + 1;
          pLVar7 = this_00;
        }
        else {
          iVar10 = *(U32 *)&p_Var5->field_0x4 - UVar3;
          if (0 < iVar10) {
            (pLVar7->super_LASintervalCell).end = *(U32 *)&p_Var5->field_0x4;
            pUVar1 = &this->merged_cells->total;
            *pUVar1 = *pUVar1 + iVar10;
          }
          this->number_intervals = this->number_intervals - 1;
        }
        if (erase) {
          operator_delete(p_Var5);
        }
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_LASintervalCell_*>,_std::_Select1st<std::pair<const_unsigned_int,_LASintervalCell_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
      ::~_Rb_tree(&map._M_t);
      pLVar7 = this->merged_cells;
    }
    this->current_cell = &pLVar7->super_LASintervalCell;
    UVar3 = pLVar7->total;
    this->full = pLVar7->full;
    this->total = UVar3;
    BVar6 = true;
  }
  return BVar6;
}

Assistant:

BOOL LASinterval::merge(const BOOL erase)
{
  // maybe delete temporary merge cells from the previous merge
  if (merged_cells)
  {
    if (merged_cells_temporary)
    {
      LASintervalCell* next_next;
      LASintervalCell* next = merged_cells->next;
      while (next)
      {
        next_next = next->next;
        delete next;
        next = next_next;
      }
      delete merged_cells;
    }
    merged_cells = 0;
  }
  // are there cells to merge
  if (cells_to_merge == 0) return FALSE;
  if (((my_cell_set*)cells_to_merge)->size() == 0) return FALSE;
  // is there just one cell
  if (((my_cell_set*)cells_to_merge)->size() == 1)
  {
    merged_cells_temporary = FALSE;
    // simply use this cell as the merge cell
    my_cell_set::iterator set_element = ((my_cell_set*)cells_to_merge)->begin();
    merged_cells = (*set_element);
  }
  else
  {
    merged_cells_temporary = TRUE;
    merged_cells = new LASintervalStartCell();
    // iterate over all cells and add their intervals to map
    LASintervalCell* cell;
    my_cell_map map;
    my_cell_set::iterator set_element = ((my_cell_set*)cells_to_merge)->begin();
#pragma warning(push)
#pragma warning(disable : 6011)
    while (true)
    {
      if (set_element == ((my_cell_set*)cells_to_merge)->end()) break;
      cell = (*set_element);
      merged_cells->full += ((LASintervalStartCell*)cell)->full;
      while (cell)
      {
        map.insert(my_cell_map::value_type(cell->start, cell));
        cell = cell->next;
      }
      set_element++;
    }
#pragma warning(pop)
    // initialize merged_cells with first interval
    my_cell_map::iterator map_element = map.begin();
    cell = (*map_element).second;
    map.erase(map_element);
    merged_cells->start = cell->start;
    merged_cells->end = cell->end;
    merged_cells->total = cell->end - cell->start + 1;
    if (erase) delete cell;
    // merge intervals
    LASintervalCell* last_cell = merged_cells;
    I32 diff;
    while (map.size())
    {
      map_element = map.begin();
      cell = (*map_element).second;
      map.erase(map_element);
      diff = cell->start - last_cell->end;
      if (diff > (I32)threshold)
      {
        last_cell->next = new LASintervalCell(cell);
        last_cell = last_cell->next;
        merged_cells->total += (cell->end - cell->start + 1);
      }
      else
      {
        diff = cell->end - last_cell->end;
        if (diff > 0)
        {
          last_cell->end = cell->end;
          merged_cells->total += diff;
        }
        number_intervals--;
      }
      if (erase) delete cell;
    }
  }
  current_cell = merged_cells;
  full = merged_cells->full;
  total = merged_cells->total;
  return TRUE;
}